

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,int jobs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  cmGlobalGenerator *gg;
  string *psVar6;
  size_type *psVar7;
  pointer ppcVar8;
  pointer pcVar9;
  string local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  string *local_3e8;
  string *local_3e0;
  string *local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d0 [2];
  size_type local_3c0 [2];
  cmWorkingDirectory workdir;
  cmake cm;
  
  this->IsSourceFileTryCompile = fast;
  local_3e8 = srcdir;
  bVar3 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar3) {
    cmsys::SystemTools::MakeDirectory(bindir,(mode_t *)0x0);
  }
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  if (workdir.ResultCode != 0) {
    std::operator+(&local_408,"Failed to set working directory to ",bindir);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_408);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_428.field_2._M_allocated_capacity = *psVar7;
      local_428.field_2._8_8_ = plVar5[3];
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    }
    else {
      local_428.field_2._M_allocated_capacity = *psVar7;
      local_428._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_428._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    strerror(workdir.ResultCode);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_428);
    pppcVar2 = &cm.Generators.
                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppcVar8 = (pointer)(plVar5 + 2);
    if ((pointer)*plVar5 == ppcVar8) {
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar8;
      cm.ExtraGenerators.
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar5[3];
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar2;
    }
    else {
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar8;
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar5;
    }
    cm.Generators.
    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar5[1];
    *plVar5 = (long)ppcVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    IssueMessage(this,FATAL_ERROR,(string *)&cm);
    if (cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar2) {
      operator_delete(cm.Generators.
                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)cm.Generators.
                            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::s_FatalErrorOccured = true;
    this->IsSourceFileTryCompile = false;
    iVar4 = 1;
    goto LAB_002f233c;
  }
  cmake::cmake(&cm,RoleProject,Project);
  cmake::SetIsInTryCompile(&cm,true);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_428);
  local_3e0 = projectName;
  local_3d8 = targetName;
  gg = cmake::CreateGlobalGenerator(&cm,&local_428);
  paVar1 = &local_428.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != paVar1) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  local_428._M_dataplus._M_p = (pointer)paVar1;
  if (gg == (cmGlobalGenerator *)0x0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_3d0);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_3d0,0,(char *)0x0,0x49ec41);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_408.field_2._M_allocated_capacity = *psVar7;
      local_408.field_2._8_8_ = plVar5[3];
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    }
    else {
      local_408.field_2._M_allocated_capacity = *psVar7;
      local_408._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_408._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_408);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_428.field_2._M_allocated_capacity = *psVar7;
      local_428.field_2._8_8_ = plVar5[3];
    }
    else {
      local_428.field_2._M_allocated_capacity = *psVar7;
      local_428._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_428._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    IssueMessage(this,INTERNAL_ERROR,&local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if (local_3d0[0] !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0) {
LAB_002f2311:
      operator_delete(local_3d0[0],local_3c0[0] + 1);
    }
LAB_002f2319:
    cmSystemTools::s_FatalErrorOccured = true;
    iVar4 = 1;
  }
  else {
    gg->RecursionDepth = this->RecursionDepth;
    cmake::SetGlobalGenerator(&cm,gg);
    cmake::SetHomeDirectory(&cm,local_3e8);
    cmake::SetHomeOutputDirectory(&cm,bindir);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_428,"CMAKE_GENERATOR_INSTANCE","");
    GetSafeDefinition(this,&local_428);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorInstance);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    local_428._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_428,"CMAKE_GENERATOR_PLATFORM","");
    GetSafeDefinition(this,&local_428);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorPlatform);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    local_428._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_428,"CMAKE_GENERATOR_TOOLSET","");
    GetSafeDefinition(this,&local_428);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorToolset);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    cmake::LoadCache(&cm);
    iVar4 = (*gg->_vptr_cmGlobalGenerator[0x23])(gg);
    if ((char)iVar4 == '\0') {
      local_428._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_428,"CMAKE_TRY_COMPILE_CONFIGURATION","");
      psVar6 = GetDef(this,&local_428);
      if (psVar6 == (string *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar9 = (psVar6->_M_dataplus)._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != paVar1) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if (pcVar9 != (char *)0x0) {
        local_428._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"CMAKE_BUILD_TYPE","");
        cmake::AddCacheEntry(&cm,&local_428,pcVar9,"Build configuration",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != paVar1) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_428._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_428,"CMAKE_MAXIMUM_RECURSION_DEPTH","");
    psVar6 = GetDef(this,&local_428);
    if (psVar6 == (string *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = (psVar6->_M_dataplus)._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if (pcVar9 != (char *)0x0) {
      local_428._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_428,"CMAKE_MAXIMUM_RECURSION_DEPTH","");
      cmake::AddCacheEntry(&cm,&local_428,pcVar9,"Maximum recursion depth",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != paVar1) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
    }
    if (cmakeArgs !=
        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      cm.WarnUnusedCli = false;
      cmake::SetCacheArgs(&cm,cmakeArgs);
    }
    cmGlobalGenerator::EnableLanguagesFromGenerator(gg,this->GlobalGenerator,this);
    local_428._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_428,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
    bVar3 = IsOn(this,&local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_428._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_428,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
      cmake::AddCacheEntry(&cm,&local_428,"TRUE","",4);
    }
    else {
      local_428._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_428,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
      cmake::AddCacheEntry(&cm,&local_428,"FALSE","",4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    iVar4 = cmake::Configure(&cm);
    if (iVar4 != 0) {
      local_428._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_428,"Failed to configure test project build system.","");
      IssueMessage(this,FATAL_ERROR,&local_428);
LAB_002f2303:
      local_3c0[0] = local_428.field_2._M_allocated_capacity;
      local_3d0[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_428._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != paVar1) goto LAB_002f2311;
      goto LAB_002f2319;
    }
    iVar4 = cmake::Generate(&cm);
    if (iVar4 != 0) {
      local_428._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_428,"Failed to generate test project build system.","");
      IssueMessage(this,FATAL_ERROR,&local_428);
      goto LAB_002f2303;
    }
    iVar4 = cmGlobalGenerator::TryCompile
                      (this->GlobalGenerator,jobs,local_3e8,bindir,local_3e0,local_3d8,fast,output,
                       this);
  }
  this->IsSourceFileTryCompile = false;
  cmake::~cmake(&cm);
LAB_002f233c:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar4;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast, int jobs,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir);
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);
  if (workdir.Failed()) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to set working directory to " + bindir + " : " +
                         std::strerror(workdir.GetLastResult()));
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject, cmState::Project);
  cm.SetIsInTryCompile(true);
  cmGlobalGenerator* gg =
    cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  gg->RecursionDepth = this->RecursionDepth;
  cm.SetGlobalGenerator(gg);

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorInstance(this->GetSafeDefinition("CMAKE_GENERATOR_INSTANCE"));
  cm.SetGeneratorPlatform(this->GetSafeDefinition("CMAKE_GENERATOR_PLATFORM"));
  cm.SetGeneratorToolset(this->GetSafeDefinition("CMAKE_GENERATOR_TOOLSET"));
  cm.LoadCache();
  if (!gg->IsMultiConfig()) {
    if (const char* config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  const char* recursionDepth =
    this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (recursionDepth) {
    cm.AddCacheEntry("CMAKE_MAXIMUM_RECURSION_DEPTH", recursionDepth,
                     "Maximum recursion depth", cmStateEnums::STRING);
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs to honor options like --warn-unused-vars.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --warn-unused-vars.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  gg->EnableLanguagesFromGenerator(this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    jobs, srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}